

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O1

void __thiscall QMdiArea::scrollContentsBy(QMdiArea *this,int dx,int dy)

{
  bool bVar1;
  QMdiAreaPrivate *this_00;
  LayoutDirection LVar2;
  QWidget *this_01;
  int dx_00;
  
  this_00 = *(QMdiAreaPrivate **)
             &(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  bVar1 = this_00->isSubWindowsTiled;
  this_00->ignoreGeometryChange = true;
  this_01 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
  LVar2 = QWidget::layoutDirection((QWidget *)this);
  dx_00 = -dx;
  if (LVar2 == LeftToRight) {
    dx_00 = dx;
  }
  QWidget::scroll(this_01,dx_00,dy);
  QMdiAreaPrivate::arrangeMinimizedSubWindows(this_00);
  this_00->ignoreGeometryChange = false;
  if (bVar1 == true) {
    this_00->isSubWindowsTiled = true;
  }
  return;
}

Assistant:

void QMdiArea::scrollContentsBy(int dx, int dy)
{
    Q_D(QMdiArea);
    const bool wasSubWindowsTiled = d->isSubWindowsTiled;
    d->ignoreGeometryChange = true;
    viewport()->scroll(isLeftToRight() ? dx : -dx, dy);
    d->arrangeMinimizedSubWindows();
    d->ignoreGeometryChange = false;
    if (wasSubWindowsTiled)
        d->isSubWindowsTiled = true;
}